

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O1

int fits_read_wcstab(fitsfile *fptr,int nwtb,wtbarr *wtb,int *status)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  double ***pppdVar5;
  size_t *naxes;
  double *pdVar6;
  int iVar7;
  long lVar8;
  size_t __nmemb;
  wtbarr *pwVar9;
  int naxis;
  int *local_60;
  int colnum;
  fitsfile *local_50;
  size_t *local_48;
  int hdunum;
  int nostat;
  int anynul;
  
  if (*status != 0) {
    return *status;
  }
  if (fptr == (fitsfile *)0x0) {
    *status = 0x73;
    iVar7 = 0x73;
  }
  else if (nwtb == 0) {
    iVar7 = 0;
  }
  else {
    if (0 < nwtb) {
      pppdVar5 = &wtb->arrayp;
      iVar7 = nwtb;
      do {
        **pppdVar5 = (double *)0x0;
        pppdVar5 = pppdVar5 + 0x19;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    ffghdn(fptr,&hdunum);
    local_48 = (size_t *)0x0;
    naxes = local_48;
    if (0 < nwtb) {
      iVar7 = 0;
      pwVar9 = wtb;
      local_60 = status;
      local_50 = fptr;
      do {
        iVar3 = ffmnhd(fptr,2,pwVar9->extnam,pwVar9->extver,status);
        naxes = local_48;
        if ((iVar3 != 0) ||
           (iVar3 = ffgcno(fptr,0,pwVar9->ttype,&colnum,status), naxes = local_48, iVar3 != 0))
        break;
        iVar3 = pwVar9->ndim;
        if ((long)iVar3 < 1) {
          iVar4 = 0x143;
LAB_001b6523:
          naxes = (size_t *)0x0;
          status = local_60;
LAB_001b6541:
          *status = iVar4;
          fptr = local_50;
          break;
        }
        naxes = (size_t *)calloc((long)iVar3,8);
        status = local_60;
        iVar4 = 0x71;
        if (naxes == (size_t *)0x0) goto LAB_001b6523;
        iVar3 = ffgtdm(local_50,colnum,iVar3,&naxis,(long *)naxes,local_60);
        fptr = local_50;
        if (iVar3 != 0) break;
        if (naxis != pwVar9->ndim) {
          if ((pwVar9->ndim == 2) && (pwVar9->kind == 99)) {
            naxis = 2;
            naxes[1] = *naxes;
            *naxes = 1;
            goto LAB_001b643c;
          }
          iVar4 = 0x107;
          goto LAB_001b6541;
        }
LAB_001b643c:
        __nmemb = *naxes;
        if (pwVar9->kind == 99) {
          if (1 < naxis) {
            piVar1 = pwVar9->dimlen;
            lVar8 = 0;
            do {
              sVar2 = naxes[lVar8 + 1];
              piVar1[lVar8] = (int)sVar2;
              lVar8 = lVar8 + 1;
              __nmemb = __nmemb * sVar2;
            } while (lVar8 < (long)naxis + -1);
          }
        }
        else if (__nmemb != (long)*pwVar9->dimlen) {
          iVar4 = 0x107;
          status = local_60;
          goto LAB_001b6541;
        }
        free(naxes);
        pdVar6 = (double *)calloc(__nmemb,8);
        fptr = local_50;
        status = local_60;
        *pwVar9->arrayp = pdVar6;
        if (pdVar6 == (double *)0x0) {
          naxes = (size_t *)0x0;
          iVar4 = 0x71;
          goto LAB_001b6541;
        }
        iVar3 = ffgcvd(local_50,colnum,pwVar9->row,1,__nmemb,0.0,*pwVar9->arrayp,&anynul,local_60);
        naxes = local_48;
        if (iVar3 != 0) break;
        iVar7 = iVar7 + 1;
        pwVar9 = pwVar9 + 1;
      } while (iVar7 < nwtb);
    }
    local_48 = naxes;
    nostat = 0;
    ffmahd(fptr,hdunum,(int *)0x0,&nostat);
    if (local_48 != (size_t *)0x0) {
      free(local_48);
    }
    if (0 < nwtb && *status != 0) {
      pppdVar5 = &wtb->arrayp;
      do {
        if (**pppdVar5 != (double *)0x0) {
          free(**pppdVar5);
        }
        pppdVar5 = pppdVar5 + 0x19;
        nwtb = nwtb + -1;
      } while (nwtb != 0);
    }
    iVar7 = *status;
  }
  return iVar7;
}

Assistant:

int fits_read_wcstab(
   fitsfile   *fptr, /* I - FITS file pointer           */
   int  nwtb,        /* Number of arrays to be read from the binary table(s) */
   wtbarr *wtb,      /* Address of the first element of an array of wtbarr
                         typedefs.  This wtbarr typedef is defined below to
                         match the wtbarr struct defined in WCSLIB.  An array
                         of such structs returned by the WCSLIB function
                         wcstab(). */
   int  *status)

/*
*   Author: Mark Calabretta, Australia Telescope National Facility
*   http://www.atnf.csiro.au/~mcalabre/index.html
*
*   fits_read_wcstab() extracts arrays from a binary table required in
*   constructing -TAB coordinates.  This helper routine is intended for
*   use by routines in the WCSLIB library when dealing with the -TAB table
*   look up WCS convention.
*/

{
   int  anynul, colnum, hdunum, iwtb, m, naxis, nostat;
   long *naxes = 0, nelem;
   wtbarr *wtbp;


   if (*status) return *status;

   if (fptr == 0) {
      return (*status = NULL_INPUT_PTR);
   }

   if (nwtb == 0) return 0;

   /* Zero the array pointers. */
   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
     *wtbp->arrayp = 0x0;
   }

   /* Save HDU number so that we can move back to it later. */
   fits_get_hdu_num(fptr, &hdunum);

   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
      /* Move to the required binary table extension. */
      if (fits_movnam_hdu(fptr, BINARY_TBL, (char *)(wtbp->extnam),
          wtbp->extver, status)) {
         goto cleanup;
      }

      /* Locate the table column. */
      if (fits_get_colnum(fptr, CASEINSEN, (char *)(wtbp->ttype), &colnum,
          status)) {
         goto cleanup;
      }

      /* Get the array dimensions and check for consistency. */
      if (wtbp->ndim < 1) {
         *status = NEG_AXIS;
         goto cleanup;
      }

      if (!(naxes = calloc(wtbp->ndim, sizeof(long)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      if (fits_read_tdim(fptr, colnum, wtbp->ndim, &naxis, naxes, status)) {
         goto cleanup;
      }

      if (naxis != wtbp->ndim) {
         if (wtbp->kind == 'c' && wtbp->ndim == 2) {
            /* Allow TDIMn to be omitted for degenerate coordinate arrays. */
            naxis = 2;
            naxes[1] = naxes[0];
            naxes[0] = 1;
         } else {
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      if (wtbp->kind == 'c') {
         /* Coordinate array; calculate the array size. */
         nelem = naxes[0];
         for (m = 0; m < naxis-1; m++) {
            *(wtbp->dimlen + m) = naxes[m+1];
            nelem *= naxes[m+1];
         }
      } else {
         /* Index vector; check length. */
         if ((nelem = naxes[0]) != *(wtbp->dimlen)) {
            /* N.B. coordinate array precedes the index vectors. */
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      free(naxes);
      naxes = 0;

      /* Allocate memory for the array. */
      if (!(*wtbp->arrayp = calloc((size_t)nelem, sizeof(double)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      /* Read the array from the table. */
      if (fits_read_col_dbl(fptr, colnum, wtbp->row, 1L, nelem, 0.0,
          *wtbp->arrayp, &anynul, status)) {
         goto cleanup;
      }
   }

cleanup:
   /* Move back to the starting HDU. */
   nostat = 0;
   fits_movabs_hdu(fptr, hdunum, 0, &nostat);

   /* Release allocated memory. */
   if (naxes) free(naxes);
   if (*status) {
      wtbp = wtb;
      for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
         if (*wtbp->arrayp) free(*wtbp->arrayp);
      }
   }

   return *status;
}